

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printPrefetchOp(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  cs_ac_type cVar3;
  MCOperand *op;
  int64_t iVar4;
  cs_struct *h;
  uint in_ESI;
  MCInst *in_RDI;
  uint8_t access;
  char *Name;
  _Bool Valid;
  uint prfop;
  char *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  _Bool local_1d;
  uint32_t local_1c;
  MCInst *local_8;
  
  local_8 = in_RDI;
  op = MCInst_getOperand(in_RDI,in_ESI);
  iVar4 = MCOperand_getImm(op);
  local_1c = (uint32_t)iVar4;
  h = (cs_struct *)A64NamedImmMapper_toString(&A64PRFM_PRFMMapper,local_1c,&local_1d);
  if ((local_1d & 1U) == 0) {
    printInt32Bang((SStream *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (int32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    if (local_8->csh->detail != CS_OPT_OFF) {
      MCInst_getOpcode(local_8);
      cVar3 = get_op_access(h,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
      local_8->flat_insn->detail->groups
      [(ulong)(local_8->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar3;
      local_8->ac_idx = local_8->ac_idx + '\x01';
      puVar1 = local_8->flat_insn->detail->groups +
               (ulong)(local_8->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      *(ulong *)(local_8->flat_insn->detail->groups +
                (ulong)(local_8->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) =
           (ulong)local_1c;
      pcVar2 = local_8->flat_insn->detail;
      (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
    }
  }
  else {
    SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8);
    if (local_8->csh->detail != CS_OPT_OFF) {
      puVar1 = local_8->flat_insn->detail->groups +
               (ulong)(local_8->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar1[0] = 'E';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      *(uint32_t *)
       (local_8->flat_insn->detail->groups +
       (ulong)(local_8->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) = local_1c + 1;
      pcVar2 = local_8->flat_insn->detail;
      (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
    }
  }
  return;
}

Assistant:

static void printPrefetchOp(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned prfop = (unsigned)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	bool Valid;
	const char *Name = A64NamedImmMapper_toString(&A64PRFM_PRFMMapper, prfop, &Valid);

	if (Valid) {
		SStream_concat0(O, Name);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_PREFETCH;
			// we have to plus 1 to prfop because 0 is a valid value of prfop
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].prefetch = prfop + 1;
			MI->flat_insn->detail->arm64.op_count++;
		}
	} else {
		printInt32Bang(O, prfop);
		if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
			uint8_t access;
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = prfop;
			MI->flat_insn->detail->arm64.op_count++;
		}
	}
}